

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O1

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::StreamReadStartStop
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  if (this->Stream != (uv_stream_t *)0x0) {
    uv_read_stop(this->Stream);
    if (*(ulong *)&this->field_0x18 <= *(ulong *)&this->field_0x10) {
      uv_read_start(this->Stream,StreamReadStartStop::anon_class_1_0_00000001::__invoke,
                    StreamReadStartStop::anon_class_1_0_00000001::__invoke);
      return;
    }
  }
  return;
}

Assistant:

void cmBasicUVStreambuf<CharT, Traits>::StreamReadStartStop()
{
  if (this->Stream) {
    uv_read_stop(this->Stream);
    if (this->gptr() >= this->egptr()) {
      uv_read_start(
        this->Stream,
        [](uv_handle_t* handle, size_t /* unused */, uv_buf_t* buf) {
          auto streambuf =
            static_cast<cmBasicUVStreambuf<CharT, Traits>*>(handle->data);
          streambuf->HandleAlloc(buf);
        },
        [](uv_stream_t* stream2, ssize_t nread, const uv_buf_t* /* unused */) {
          auto streambuf =
            static_cast<cmBasicUVStreambuf<CharT, Traits>*>(stream2->data);
          streambuf->StreamRead(nread);
        });
    }
  }
}